

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib582.c
# Opt level: O0

int curlTimerCallback(CURLM *multi,long timeout_ms,void *userp)

{
  timeval tVar1;
  undefined8 local_38;
  undefined8 local_30;
  timeval *timeout;
  void *userp_local;
  long timeout_ms_local;
  CURLM *multi_local;
  
  if (timeout_ms == -1) {
    *(undefined8 *)userp = 0xffffffffffffffff;
  }
  else {
    tVar1 = tutil_tvnow();
    local_38 = tVar1.tv_sec;
    *(__time_t *)userp = local_38;
    local_30 = tVar1.tv_usec;
    *(__suseconds_t *)((long)userp + 8) = local_30;
    *(long *)((long)userp + 8) = timeout_ms * 1000 + *(long *)((long)userp + 8);
  }
  return 0;
}

Assistant:

static int curlTimerCallback(CURLM *multi, long timeout_ms, void *userp)
{
  struct timeval* timeout = userp;

  (void)multi; /* unused */
  if(timeout_ms != -1) {
    *timeout = tutil_tvnow();
    timeout->tv_usec += timeout_ms * 1000;
  }
  else {
    timeout->tv_sec = -1;
  }
  return 0;
}